

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

stumpless_param * stumpless_set_param_name(stumpless_param *param,char *name)

{
  _Bool _Var1;
  char *message;
  size_t new_size;
  size_t local_20;
  
  if (param == (stumpless_param *)0x0) {
    message = "param was NULL";
  }
  else {
    if (name != (char *)0x0) {
      _Var1 = validate_param_name(name,&local_20);
      if (!_Var1) {
        return (stumpless_param *)0x0;
      }
      pthread_lock_mutex((pthread_mutex_t *)param->mutex);
      param->name_length = local_20;
      memcpy(param,name,local_20);
      param->name[local_20] = '\0';
      pthread_unlock_mutex((pthread_mutex_t *)param->mutex);
      clear_error();
      return param;
    }
    message = "name was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_param *)0x0;
}

Assistant:

struct stumpless_param *
stumpless_set_param_name( struct stumpless_param *param, const char *name ) {
  size_t new_size;

  VALIDATE_ARG_NOT_NULL( param );
  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_param_name( name, &new_size ) ) ) {
    goto fail;
  }

  lock_param( param );
  param->name_length = new_size;
  memcpy( param->name, name, new_size );
  param->name[new_size] = '\0';
  unlock_param( param );

  clear_error(  );
  return param;

fail:
  return NULL;
}